

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ftint_u_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  long lVar4;
  uint uVar5;
  uint32_t uVar6;
  float32 fVar7;
  uint64_t uVar8;
  float64 fVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar14;
  long lVar15;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  uint uVar13;
  
  lVar4 = (ulong)ws * 0x10 + 0x338;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar15 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      uVar6 = float32_to_uint32_mips64el
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar15 * 4 + lVar4 + -0x338),
                         pfVar2);
      *(uint32_t *)((long)local_40 + lVar15 * 4) = uVar6;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mips64el((uint)bVar3);
      uVar10 = (env->active_tc).msacsr;
      uVar14 = (uVar10 & 0x1000000) >> 0x18 & (uint)(bVar3 >> 6) | uVar5;
      uVar5 = (uVar5 & 0xfffffffc) + 1;
      if ((uVar10 & 0x1000000) == 0) {
        uVar5 = uVar14;
      }
      if (-1 < (char)bVar3) {
        uVar5 = uVar14;
      }
      uVar13 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar12 = uVar13 | uVar5;
      uVar14 = uVar5 & 0xfffffffc;
      if ((uVar13 != 0 || (uVar5 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar14 = uVar12;
      }
      if ((uVar5 & 2) == 0) {
        uVar14 = uVar12;
      }
      if ((uVar14 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar5 = uVar14 << 0xc;
LAB_0098ac6f:
        (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar5 = uVar14 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_0098ac6f;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar14) == 0) {
        uVar14 = 0;
        if (0x7f800000 <
            (*(uint *)((long)(env->active_fpu).fpr + lVar15 * 4 + lVar4 + -0x338) & 0x7fffffff))
        goto LAB_0098acb5;
      }
      else {
        fVar7 = float32_default_nan_mips64el(pfVar2);
        uVar14 = fVar7 & 0xffffffc0 ^ 0x400000 | uVar14;
LAB_0098acb5:
        *(uint *)((long)local_40 + lVar15 * 4) = uVar14;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1cb3,
                    "void helper_msa_ftint_u_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar15 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      uVar8 = float64_to_uint64_mips64el
                        (*(float64 *)((long)(env->active_fpu).fpr + lVar15 * 8 + lVar4 + -0x338),
                         pfVar2);
      local_40[lVar15] = uVar8;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mips64el((uint)bVar3);
      uVar10 = (env->active_tc).msacsr;
      uVar14 = (uVar10 & 0x1000000) >> 0x18 & (uint)(bVar3 >> 6) | uVar5;
      uVar5 = (uVar5 & 0xfffffffc) + 1;
      if ((uVar10 & 0x1000000) == 0) {
        uVar5 = uVar14;
      }
      if (-1 < (char)bVar3) {
        uVar5 = uVar14;
      }
      uVar13 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar12 = uVar13 | uVar5;
      uVar14 = uVar5 & 0xfffffffc;
      if ((uVar13 != 0 || (uVar5 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar14 = uVar12;
      }
      if ((uVar5 & 2) == 0) {
        uVar14 = uVar12;
      }
      if ((uVar14 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar5 = uVar14 << 0xc;
LAB_0098ab36:
        (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar5 = uVar14 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_0098ab36;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar14) == 0) {
        if (0x7ff0000000000000 <
            (*(ulong *)((long)(env->active_fpu).fpr + lVar15 * 8 + lVar4 + -0x338) &
            0x7fffffffffffffff)) {
          uVar11 = 0;
          goto LAB_0098ab88;
        }
      }
      else {
        fVar9 = float64_default_nan_mips64el(pfVar2);
        uVar11 = (long)(int)uVar14 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
LAB_0098ab88:
        local_40[lVar15] = uVar11;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 == 1);
  }
  uVar10 = (env->active_tc).msacsr;
  uVar5 = uVar10 >> 7 & 0x1f | 0x20;
  if ((uVar5 & uVar10 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar5);
  }
  (env->active_tc).msacsr = (uVar10 >> 0xc & 0x1f) << 2 | uVar10;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_ftint_u_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP0(pwx->w[i], to_uint32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP0(pwx->d[i], to_uint64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}